

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::PolyOffsetBuilder::DoSquare(PolyOffsetBuilder *this,double mul)

{
  double __y;
  double dVar1;
  size_t sVar2;
  pointer pDVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  ulong in_XMM0_Qb;
  double dVar8;
  double dVar9;
  double dVar10;
  IntPoint local_58;
  double local_48;
  ulong uStack_40;
  double local_30;
  IntPoint local_28;
  
  sVar2 = this->m_j;
  pDVar3 = (this->normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = *(long *)&(this->m_p).
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl;
  dVar8 = (double)*(long *)(lVar5 + sVar2 * 0x10);
  dVar7 = pDVar3[this->m_k].X;
  __y = pDVar3[this->m_k].Y;
  dVar1 = this->m_delta;
  dVar9 = dVar7 * dVar1 + dVar8;
  uVar6 = -(ulong)(dVar9 < 0.0);
  lVar4 = (long)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar9);
  dVar9 = (double)*(long *)(lVar5 + 8 + sVar2 * 0x10);
  dVar10 = __y * dVar1 + dVar9;
  uVar6 = -(ulong)(dVar10 < 0.0);
  lVar5 = (long)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar10);
  dVar8 = pDVar3[sVar2].X * dVar1 + dVar8;
  uVar6 = -(ulong)(dVar8 < 0.0);
  local_58.X = (long64)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar8);
  dVar9 = pDVar3[sVar2].Y * dVar1 + dVar9;
  uVar6 = -(ulong)(dVar9 < 0.0);
  local_58.Y = (long64)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar9);
  local_28.X = lVar4;
  local_28.Y = lVar5;
  if (0.0 <= (dVar7 * pDVar3[sVar2].Y - pDVar3[sVar2].X * __y) * dVar1) {
    local_48 = mul;
    uStack_40 = in_XMM0_Qb;
    local_30 = atan2(__y,dVar7);
    pDVar3 = (this->normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar7 = atan2(-pDVar3[this->m_j].Y,-pDVar3[this->m_j].X);
    dVar7 = ABS(dVar7 - local_30);
    dVar7 = tan((3.141592653589793 -
                (double)(~-(ulong)(3.141592653589793 < dVar7) & (ulong)dVar7 |
                        (ulong)(6.283185307179586 - dVar7) & -(ulong)(3.141592653589793 < dVar7))) *
                0.25);
    uStack_40 = uStack_40 & 0x7fffffffffffffff;
    local_48 = ABS(local_48 * this->m_delta) * dVar7;
    pDVar3 = (this->normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_28.X = (long64)((double)lVar4 - pDVar3[this->m_k].Y * local_48);
    local_28.Y = (long64)(pDVar3[this->m_k].X * local_48 + (double)lVar5);
    AddPoint(this,&local_28);
    pDVar3 = (this->normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_58.X = (long64)(pDVar3[this->m_j].Y * local_48 + (double)local_58.X);
    local_58.Y = (long64)((double)local_58.Y - local_48 * pDVar3[this->m_j].X);
  }
  else {
    AddPoint(this,&local_28);
    AddPoint(this,(IntPoint *)
                  (this->m_j * 0x10 +
                  *(long *)&(this->m_p).
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl));
  }
  AddPoint(this,&local_58);
  return;
}

Assistant:

void DoSquare(double mul = 1.0)
{
    IntPoint pt1 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_k].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_k].Y * m_delta));
    IntPoint pt2 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_j].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_j].Y * m_delta));
    if ((normals[m_k].X * normals[m_j].Y - normals[m_j].X * normals[m_k].Y) * m_delta >= 0)
    {
      double a1 = std::atan2(normals[m_k].Y, normals[m_k].X);
      double a2 = std::atan2(-normals[m_j].Y, -normals[m_j].X);
      a1 = std::fabs(a2 - a1);
      if (a1 > pi) a1 = pi * 2 - a1;
      double dx = std::tan((pi - a1)/4) * std::fabs(m_delta * mul);
      pt1 = IntPoint((long64)(pt1.X -normals[m_k].Y * dx),
        (long64)(pt1.Y + normals[m_k].X * dx));
      AddPoint(pt1);
      pt2 = IntPoint((long64)(pt2.X + normals[m_j].Y * dx),
        (long64)(pt2.Y -normals[m_j].X * dx));
      AddPoint(pt2);
    }
    else
    {
      AddPoint(pt1);
      AddPoint(m_p[m_i][m_j]);
      AddPoint(pt2);
    }
}